

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PEFile.h
# Opt level: O2

void __thiscall PEFile::~PEFile(PEFile *this)

{
  (this->super_MappedExe).super_Executable.super_AbstractByteBuffer._vptr_AbstractByteBuffer =
       (_func_int **)&PTR__PEFile_0014cfe8;
  (this->super_MappedExe).super_ExeWrappersContainer._vptr_ExeWrappersContainer =
       (_func_int **)&PTR__PEFile_0014d108;
  clearWrappers(this);
  if (this->album != (ResourcesAlbum *)0x0) {
    (*this->album->_vptr_ResourcesAlbum[1])();
  }
  QMutex::~QMutex(&this->m_peMutex);
  PECore::~PECore(&this->core);
  ExeWrappersContainer::~ExeWrappersContainer(&(this->super_MappedExe).super_ExeWrappersContainer);
  return;
}

Assistant:

virtual ~PEFile() { clearWrappers(); delete album; }